

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vpmsumw_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong uStack_48;
  uint64_t prod [4];
  int j;
  int i;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (prod[3]._4_4_ = 3; -1 < prod[3]._4_4_; prod[3]._4_4_ = prod[3]._4_4_ + -1) {
    prod[(long)prod[3]._4_4_ + -1] = 0;
    for (prod[3]._0_4_ = 0; (uint)prod[3] < 0x20; prod[3]._0_4_ = (uint)prod[3] + 1) {
      if (((ulong)a->u32[prod[3]._4_4_] & 1L << ((byte)(uint)prod[3] & 0x3f)) != 0) {
        prod[(long)prod[3]._4_4_ + -1] =
             (ulong)b->u32[prod[3]._4_4_] << ((byte)(uint)prod[3] & 0x3f) ^
             prod[(long)prod[3]._4_4_ + -1];
      }
    }
  }
  for (prod[3]._4_4_ = 1; -1 < prod[3]._4_4_; prod[3]._4_4_ = prod[3]._4_4_ + -1) {
    r->u64[prod[3]._4_4_] =
         prod[(long)(prod[3]._4_4_ << 1) + -1] ^ prod[(long)(prod[3]._4_4_ * 2 + 1) + -1];
  }
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}